

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartDTD(xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid)

{
  xmlOutputBufferPtr out;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlLinkPtr lk;
  void *pvVar7;
  undefined8 *data;
  xmlChar *pxVar8;
  char *pcVar9;
  xmlParserErrors error;
  
  if (name == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  if (*name == '\0') {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  if ((lk == (xmlLinkPtr)0x0) || (pvVar7 = xmlLinkGetData(lk), pvVar7 == (void *)0x0)) {
    data = (undefined8 *)(*xmlMalloc)(0x10);
    if (data == (undefined8 *)0x0) {
      pcVar9 = "xmlTextWriterStartDTD : out of memory!\n";
      error = XML_ERR_NO_MEMORY;
      goto LAB_001ba291;
    }
    pxVar8 = xmlStrdup(name);
    *data = pxVar8;
    if (pxVar8 == (xmlChar *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTD : out of memory!\n");
      (*xmlFree)(data);
      return -1;
    }
    *(undefined4 *)(data + 1) = 7;
    xmlListPushFront(writer->nodes,data);
    iVar1 = xmlOutputBufferWriteString(writer->out,"<!DOCTYPE ");
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
    if (iVar2 < 0) {
      return -1;
    }
    iVar2 = iVar2 + iVar1;
    if (pubid == (xmlChar *)0x0) {
LAB_001ba258:
      if (sysid == (xmlChar *)0x0) {
        return iVar2;
      }
      out = writer->out;
      if (pubid == (xmlChar *)0x0) {
        pcVar9 = "\n";
        if (writer->indent == 0) {
          pcVar9 = " ";
        }
        iVar1 = xmlOutputBufferWrite(out,1,pcVar9);
        if (iVar1 < 0) {
          return -1;
        }
        iVar3 = xmlOutputBufferWriteString(writer->out,"SYSTEM ");
        if (iVar3 < 0) {
          return -1;
        }
        iVar3 = iVar1 + iVar2 + iVar3;
      }
      else {
        if (writer->indent == 0) {
          iVar3 = xmlOutputBufferWrite(out,1," ");
        }
        else {
          iVar3 = xmlOutputBufferWriteString(out,"\n       ");
        }
        if (iVar3 < 0) {
          return -1;
        }
        iVar3 = iVar3 + iVar2;
      }
      iVar1 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar1 < 0) {
        return -1;
      }
      iVar2 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
      if (iVar2 < 0) {
        return -1;
      }
      iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar4 < 0) {
        return -1;
      }
      return iVar2 + iVar4 + iVar1 + iVar3;
    }
    if (sysid != (xmlChar *)0x0) {
      pcVar9 = "\n";
      if (writer->indent == 0) {
        pcVar9 = " ";
      }
      iVar1 = xmlOutputBufferWrite(writer->out,1,pcVar9);
      if (iVar1 < 0) {
        return -1;
      }
      iVar3 = xmlOutputBufferWriteString(writer->out,"PUBLIC ");
      if (iVar3 < 0) {
        return -1;
      }
      iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar4 < 0) {
        return -1;
      }
      iVar5 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
      if (iVar5 < 0) {
        return -1;
      }
      iVar6 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar6 < 0) {
        return -1;
      }
      iVar2 = iVar3 + iVar4 + iVar5 + iVar6 + iVar1 + iVar2;
      goto LAB_001ba258;
    }
    pcVar9 = "xmlTextWriterStartDTD : system identifier needed!\n";
  }
  else {
    pcVar9 = "xmlTextWriterStartDTD : DTD allowed only in prolog!\n";
  }
  error = XML_ERR_INTERNAL_ERROR;
LAB_001ba291:
  xmlWriterErrMsg(writer,error,pcVar9);
  return -1;
}

Assistant:

int
xmlTextWriterStartDTD(xmlTextWriterPtr writer,
                      const xmlChar * name,
                      const xmlChar * pubid, const xmlChar * sysid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDTD : DTD allowed only in prolog!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_DTD;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<!DOCTYPE ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    if (pubid != 0) {
        if (sysid == 0) {
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterStartDTD : system identifier needed!\n");
            return -1;
        }

        if (writer->indent)
            count = xmlOutputBufferWrite(writer->out, 1, "\n");
        else
            count = xmlOutputBufferWrite(writer->out, 1, " ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWriteString(writer->out, "PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            if (writer->indent)
                count = xmlOutputBufferWrite(writer->out, 1, "\n");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, "SYSTEM ");
            if (count < 0)
                return -1;
            sum += count;
        } else {
			if (writer->indent)
            count = xmlOutputBufferWriteString(writer->out, "\n       ");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
        }

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}